

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O3

mpt_metatype * mpt_iterator_string(char *val,char *sep)

{
  undefined1 *puVar1;
  size_t __n;
  size_t __n_00;
  mpt_metatype *pmVar2;
  _mpt_vptr_metatype *__dest;
  
  if (val == (char *)0x0) {
    __n = 0;
    __n_00 = 0;
  }
  else {
    if (sep == (char *)0x0) {
      sep = " ,;/:";
    }
    __n = strlen(sep);
    __n_00 = strlen(val);
  }
  pmVar2 = (mpt_metatype *)malloc(__n + __n_00 + 0x52);
  if (pmVar2 != (mpt_metatype *)0x0) {
    pmVar2->_vptr = &mpt_iterator_string::ctlMeta;
    pmVar2[1]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_string::ctlIter;
    pmVar2[2]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_string::ctlConv;
    pmVar2[3]._vptr = (_mpt_vptr_metatype *)(pmVar2 + 5);
    pmVar2[4]._vptr = (_mpt_vptr_metatype *)0x80;
    pmVar2[5]._vptr = (_mpt_vptr_metatype *)(pmVar2 + 2);
    if (__n != 0) {
      memcpy(pmVar2 + 10,sep,__n);
    }
    puVar1 = (undefined1 *)((long)&pmVar2[10]._vptr + __n);
    __dest = (_mpt_vptr_metatype *)(puVar1 + 1);
    *puVar1 = 0;
    if (__n_00 != 0) {
      memcpy(__dest,val,__n_00);
    }
    *(undefined1 *)((long)&(__dest->convertable).convert + __n_00) = 0;
    pmVar2[6]._vptr = __dest;
    pmVar2[7]._vptr = (_mpt_vptr_metatype *)((long)&(__dest->convertable).convert + __n_00);
    pmVar2[8]._vptr = (_mpt_vptr_metatype *)0x0;
    *(undefined1 *)&pmVar2[9]._vptr = 0;
  }
  return pmVar2;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_string(const char *val, const char *sep)
{
	static const MPT_INTERFACE_VPTR(metatype) ctlMeta = {
		{ parseConv },
		parseUnref,
		parseRef,
		parseClone
	};
	static const MPT_INTERFACE_VPTR(iterator) ctlIter = {
		parseValue,
		parseAdvance,
		parseReset
	};
	static const MPT_INTERFACE_VPTR(convertable) ctlConv = {
		parseConvertElement
	};
	MPT_STRUCT(parseIterator) *it;
	size_t slen, vlen;
	char *dest;
	
	/* no need for separator */
	if (!val) {
		slen = vlen = 0;
	}
	else {
		if (!sep) {
			sep = " ,;/:";
		}
		slen = strlen(sep);
		vlen = strlen(val);
	}
	/* memory for header, constent and string separation/end */
	if (!(it = malloc(sizeof(*it) + slen + vlen + 2))) {
		return 0;
	}
	it->_mt._vptr = &ctlMeta;
	it->_it._vptr = &ctlIter;
	
	it->elem._conv._vptr = &ctlConv;
	MPT_value_set(&it->elem.val, MPT_ENUM(TypeConvertablePtr), &it->conv_ptr);
	it->conv_ptr = &it->elem._conv;
	
	/* save separator config */
	dest = (char *) (it + 1);
	if (slen) {
		memcpy(dest, sep, slen);
	}
	dest[slen++] = '\0';
	
	/* save value content */
	dest += slen;
	if (vlen) {
		memcpy(dest, val, vlen);
	}
	dest[vlen] = '\0';
	
	/* setup iterator data */
	it->val = dest;
	it->end = dest + vlen;
	it->restore = 0;
	it->save = 0;
	
	return &it->_mt;
}